

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_fd_linux.c
# Opt level: O2

int os_fd_linux_event_socket_modify(os_fd_select *sel,os_fd *sock)

{
  int iVar1;
  uint local_24;
  os_fd *local_20;
  
  local_24 = sock->wanted_events;
  local_20 = sock;
  if ((log_global_mask[_oonf_os_fd_subsystem.logging] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,_oonf_os_fd_subsystem.logging,"src/base/os_linux/os_fd_linux.c",0x8a
             ,(void *)0x0,0,"Modify socket %d to events 0x%x",(ulong)(uint)sock->fd,(ulong)local_24)
    ;
  }
  iVar1 = epoll_ctl(sel->_epoll_fd,3,sock->fd,(epoll_event *)&local_24);
  return iVar1;
}

Assistant:

int
os_fd_linux_event_socket_modify(struct os_fd_select *sel, struct os_fd *sock) {
  struct epoll_event event;

  memset(&event, 0, sizeof(event));

  event.events = sock->wanted_events;
  event.data.ptr = sock;

  OONF_DEBUG(LOG_OS_SOCKET, "Modify socket %d to events 0x%x", sock->fd, sock->wanted_events);
  return epoll_ctl(sel->_epoll_fd, EPOLL_CTL_MOD, sock->fd, &event);
}